

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O1

bool SocketClient::setFlags(int mFd,int flag,int getcmd,int setcmd,FlagMode mode)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  
  uVar1 = 0;
  if (mode == FlagAppend) {
    do {
      uVar1 = fcntl(mFd,getcmd,0);
      if (uVar1 != 0xffffffff) goto LAB_00161a80;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    bVar4 = false;
  }
  else {
LAB_00161a80:
    do {
      iVar2 = fcntl(mFd,setcmd,(ulong)(uVar1 | flag));
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    bVar4 = iVar2 != -1;
  }
  return bVar4;
}

Assistant:

bool SocketClient::setFlags(int mFd, int flag, int getcmd, int setcmd, FlagMode mode)
{
#ifdef _WIN32
    (void) mFd; (void) flag; (void) getcmd; (void) setcmd; (void) mode;  // unused
    return false;  // no fcntl() on windows
#else
    int flg = 0, e;
    if (mode == FlagAppend) {
        eintrwrap(e, ::fcntl(mFd, getcmd, 0));
        if (e == -1)
            return false;
        flg = e;
    }
    flg |= flag;
    eintrwrap(e, ::fcntl(mFd, setcmd, flg));
    return e != -1;
#endif
}